

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O0

void eset_stats_sub(eset_t *eset,pszind_t pind,size_t sz)

{
  size_t result_1;
  size_t result;
  size_t cur;
  size_t sz_local;
  pszind_t pind_local;
  eset_t *eset_local;
  
  eset->bin_stats[pind].nextents.repr = eset->bin_stats[pind].nextents.repr - 1;
  eset->bin_stats[pind].nbytes.repr = eset->bin_stats[pind].nbytes.repr - sz;
  return;
}

Assistant:

static void
eset_stats_sub(eset_t *eset, pszind_t pind, size_t sz) {
	size_t cur = atomic_load_zu(&eset->bin_stats[pind].nextents,
	    ATOMIC_RELAXED);
	atomic_store_zu(&eset->bin_stats[pind].nextents, cur - 1,
	    ATOMIC_RELAXED);
	cur = atomic_load_zu(&eset->bin_stats[pind].nbytes, ATOMIC_RELAXED);
	atomic_store_zu(&eset->bin_stats[pind].nbytes, cur - sz,
	    ATOMIC_RELAXED);
}